

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_range(connectdata *conn)

{
  SessionHandle *pSVar1;
  ushort **ppuVar2;
  bool bVar3;
  ftp_conn *ftpc;
  SessionHandle *data;
  char *ptr2;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  if ((((pSVar1->state).use_range & 1U) == 0) || ((pSVar1->state).range == (char *)0x0)) {
    (pSVar1->req).maxdownload = -1;
  }
  else {
    from = (curl_off_t)conn;
    to = strtol((pSVar1->state).range,&ptr2,0);
    while( true ) {
      bVar3 = false;
      if (*ptr2 != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar3 = true;
        if (((*ppuVar2)[(int)(uint)(byte)*ptr2] & 0x2000) == 0) {
          bVar3 = *ptr2 == '-';
        }
      }
      if (!bVar3) break;
      ptr2 = ptr2 + 1;
    }
    ptr = (char *)strtol(ptr2,(char **)&data,0);
    if ((SessionHandle *)ptr2 == data) {
      ptr = (char *)0xffffffffffffffff;
    }
    if ((ptr == (char *)0xffffffffffffffff) && (-1 < to)) {
      (pSVar1->state).resume_from = to;
    }
    else if (to < 0) {
      (pSVar1->req).maxdownload = -to;
      (pSVar1->state).resume_from = to;
    }
    else {
      (pSVar1->req).maxdownload = (curl_off_t)(ptr + (1 - to));
      (pSVar1->state).resume_from = to;
    }
    (conn->proto).ftpc.dont_check = true;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_range(struct connectdata *conn)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;
  struct SessionHandle *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(data->state.use_range && data->state.range) {
    from=curlx_strtoofft(data->state.range, &ptr, 0);
    while(*ptr && (ISSPACE(*ptr) || (*ptr=='-')))
      ptr++;
    to=curlx_strtoofft(ptr, &ptr2, 0);
    if(ptr == ptr2) {
      /* we didn't get any digit */
      to=-1;
    }
    if((-1 == to) && (from>=0)) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(conn->data, "FTP RANGE %" CURL_FORMAT_CURL_OFF_T
                   " to end of file\n", from));
    }
    else if(from < 0) {
      /* -Y */
      data->req.maxdownload = -from;
      data->state.resume_from = from;
      DEBUGF(infof(conn->data, "FTP RANGE the last %" CURL_FORMAT_CURL_OFF_T
                   " bytes\n", -from));
    }
    else {
      /* X-Y */
      data->req.maxdownload = (to-from)+1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(conn->data, "FTP RANGE from %" CURL_FORMAT_CURL_OFF_T
                   " getting %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(conn->data, "range-download from %" CURL_FORMAT_CURL_OFF_T
                 " to %" CURL_FORMAT_CURL_OFF_T ", totally %"
                 CURL_FORMAT_CURL_OFF_T " bytes\n",
                 from, to, data->req.maxdownload));
    ftpc->dont_check = TRUE; /* dont check for successful transfer */
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}